

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_7.cpp
# Opt level: O2

int main(void)

{
  allocator<char> local_31;
  char c;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&c,"k",&local_31);
  Symbol_table::define_name(&st,(string *)&c,1000.0,false);
  std::__cxx11::string::~string((string *)&c);
  calculate();
  return 0;
}

Assistant:

int main()
{
	st.define_name("k", 1000);
	try
	{
		calculate();
		return 0;
	}
	catch (exception& e)
	{
		cerr << "exception: " << e.what() << endl;
		char c;
		while (cin >> c && c != ';');
		return 1;
	}
	catch (...)
	{
		cerr << "exception\n";
		char c;
		while (cin >> c && c != ';');
		return 2;
	}
}